

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::VertexArrayObjectTestGroup::init
          (VertexArrayObjectTestGroup *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  undefined8 uVar106;
  undefined8 uVar107;
  undefined8 uVar108;
  int iVar109;
  int iVar110;
  undefined8 uVar111;
  TestNode *pTVar112;
  undefined1 auVar113 [16];
  int extraout_EAX;
  pointer pAVar114;
  VertexArrayObjectTest *pVVar115;
  MultiVertexArrayObjectTest *this_00;
  value_type *pvVar116;
  Attribute *__cur_1;
  ulong uVar117;
  pointer pAVar118;
  ulong uVar119;
  Attribute *__cur;
  value_type *pvVar120;
  value_type *pvVar121;
  value_type *pvVar122;
  Spec spec;
  VertexArrayState state;
  BufferSpec shortCoordBuffer48;
  BufferSpec indexBuffer;
  BufferSpec floatCoordBuffer48_1;
  BufferSpec floatCoordBuffer48_2;
  undefined1 local_190 [20];
  undefined8 uStack_17c;
  int iStack_174;
  undefined1 local_170 [16];
  pointer local_160;
  int local_158;
  undefined1 local_150 [16];
  pointer local_140;
  int local_138;
  undefined1 local_130 [16];
  pointer local_120;
  undefined1 local_118 [16];
  pointer local_108;
  undefined4 local_100;
  TestNode *local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [12];
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  ulong local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined8 local_38;
  
  auVar113 = local_a8;
  local_88._8_4_ = 2;
  local_88._0_8_ = 0x18000000030;
  local_88._12_4_ = 0;
  local_78 = ZEXT816(0x140600000000);
  local_68._0_4_ = -1.0;
  local_68._4_4_ = 1.0;
  local_58._8_4_ = 2;
  local_58._0_8_ = 0x18000000030;
  local_58._12_4_ = 0;
  local_48 = ZEXT816(0x140600000000);
  local_38._0_4_ = -1.0;
  local_38._4_4_ = 1.0;
  local_c8._0_4_ = 0.0;
  local_c8._4_4_ = 0.0;
  local_e8._8_4_ = 2;
  local_e8._0_8_ = 0xc000000030;
  local_e8._12_4_ = 0;
  local_d8 = ZEXT812(0xffff800000001402) << 0x20;
  uStack_cc = 0x8000;
  local_190._0_4_ = -1;
  local_190._4_4_ = -1;
  local_190[8] = false;
  uStack_17c._0_4_ = 0xffffffff;
  local_190._12_8_ = 0xffffffff00000000;
  uStack_17c._4_4_ = 0xffffffff;
  iStack_174 = -1;
  local_170 = (undefined1  [16])0x0;
  local_160 = (pointer)0x0;
  local_158 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = 0xffffffff;
  local_b8._0_4_ = local_b8._1_4_ << 8;
  local_b8._4_8_ = 1;
  local_b8._12_4_ = 0x1406;
  local_a8._0_4_ = local_a8._1_4_ << 8;
  local_98 = local_98 & 0xffffffff00000000;
  local_a8._13_3_ = auVar113._13_3_;
  local_a8._0_13_ = ZEXT413((uint)local_a8._0_4_);
  local_f0 = (TestNode *)this;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_118,(value_type *)local_b8);
  uVar111 = local_118._0_8_;
  *(undefined1 *)(int *)local_118._0_8_ = 1;
  *(undefined8 *)(local_118._0_8_ + 4) = 2;
  *(int *)(local_118._0_8_ + 0xc) = 0x1406;
  *(undefined1 *)(local_118._0_8_ + 0x10) = 0;
  *(undefined1 *)(local_118._0_8_ + 0x1c) = 0;
  *(undefined8 *)(local_118._0_8_ + 0x14) = 0;
  local_100 = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_130,(value_type *)local_88);
  pvVar116 = (value_type *)local_58;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_130,pvVar116);
  local_190[8] = false;
  local_190._0_4_ = 0x30;
  local_190._4_4_ = 0;
  uVar64 = local_118._8_8_;
  pvVar122 = (value_type *)(local_118._8_8_ - uVar111);
  uVar4 = local_150._0_8_;
  pvVar120 = (value_type *)((long)local_140 - local_150._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar121 = (value_type *)uVar111; pvVar121 != (value_type *)uVar64;
        pvVar121 = (value_type *)&pvVar121->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar121->floatRangeMin;
      uVar1._0_4_ = pvVar121->count;
      uVar1._4_4_ = pvVar121->size;
      iVar109 = pvVar121->componentCount;
      iVar110 = pvVar121->stride;
      uVar2._0_4_ = pvVar121->offset;
      uVar2._4_4_ = pvVar121->type;
      uVar3._0_4_ = pvVar121->intRangeMin;
      uVar3._4_4_ = pvVar121->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar2;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar2 >> 8);
      pAVar118->divisor = (int)((ulong)uVar2 >> 0x20);
      pAVar118->offset = (undefined4)uVar3;
      pAVar118->normalized = (char)((ulong)uVar3 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar3 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar1;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar1 >> 8);
      pAVar118->size = (int)((ulong)uVar1 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
      pvVar116 = pvVar120;
    }
    local_140 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_150._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_150._8_8_;
    pvVar120 = (value_type *)(local_150._8_8_ - local_150._0_8_);
    if (pvVar120 < pvVar122) {
      if (local_150._8_8_ != local_150._0_8_) {
        pvVar116 = (value_type *)uVar111;
        memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar120);
      }
      for (pvVar120 = (value_type *)((long)(int *)uVar111 + (long)&pvVar120->count);
          pvVar120 != (value_type *)uVar64; pvVar120 = (value_type *)&pvVar120->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar120->floatRangeMin;
        uVar4._0_4_ = pvVar120->count;
        uVar4._4_4_ = pvVar120->size;
        iVar109 = pvVar120->componentCount;
        iVar110 = pvVar120->stride;
        uVar5._0_4_ = pvVar120->offset;
        uVar5._4_4_ = pvVar120->type;
        uVar6._0_4_ = pvVar120->intRangeMin;
        uVar6._4_4_ = pvVar120->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar5;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar5 >> 8);
        pAVar118->divisor = (int)((ulong)uVar5 >> 0x20);
        pAVar118->offset = (undefined4)uVar6;
        pAVar118->normalized = (char)((ulong)uVar6 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar6 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar4;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar4 >> 8);
        pAVar118->size = (int)((ulong)uVar4 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (local_118._8_8_ != uVar111) {
      pvVar116 = (value_type *)uVar111;
      memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar5 = local_150._0_8_;
  local_150._8_8_ = local_150._0_8_ + (long)pvVar122;
  local_138 = 0;
  uVar4 = local_170._0_8_;
  pvVar120 = (value_type *)((long)local_160 - local_170._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar116 = (value_type *)uVar111; pvVar116 != (value_type *)uVar64;
        pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
      uVar7._0_4_ = pvVar116->count;
      uVar7._4_4_ = pvVar116->size;
      iVar109 = pvVar116->componentCount;
      iVar110 = pvVar116->stride;
      uVar8._0_4_ = pvVar116->offset;
      uVar8._4_4_ = pvVar116->type;
      uVar9._0_4_ = pvVar116->intRangeMin;
      uVar9._4_4_ = pvVar116->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar8;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar8 >> 8);
      pAVar118->divisor = (int)((ulong)uVar8 >> 0x20);
      pAVar118->offset = (undefined4)uVar9;
      pAVar118->normalized = (char)((ulong)uVar9 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar9 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar7;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar7 >> 8);
      pAVar118->size = (int)((ulong)uVar7 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
    }
    local_160 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_170._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_170._8_8_;
    pvVar116 = (value_type *)(local_170._8_8_ - local_170._0_8_);
    if (pvVar116 < pvVar122) {
      if (local_170._8_8_ != local_170._0_8_) {
        memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar116);
      }
      for (pvVar116 = (value_type *)((long)(int *)uVar111 + (long)&pvVar116->count);
          pvVar116 != (value_type *)uVar64; pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
        uVar10._0_4_ = pvVar116->count;
        uVar10._4_4_ = pvVar116->size;
        iVar109 = pvVar116->componentCount;
        iVar110 = pvVar116->stride;
        uVar11._0_4_ = pvVar116->offset;
        uVar11._4_4_ = pvVar116->type;
        uVar12._0_4_ = pvVar116->intRangeMin;
        uVar12._4_4_ = pvVar116->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar11;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar11 >> 8);
        pAVar118->divisor = (int)((ulong)uVar11 >> 0x20);
        pAVar118->offset = (undefined4)uVar12;
        pAVar118->normalized = (char)((ulong)uVar12 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar12 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar10;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar10 >> 8);
        pAVar118->size = (int)((ulong)uVar10 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (uVar64 != uVar111) {
      memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar4 = local_170._0_8_;
  local_170._8_8_ = (GLboolean *)local_170._0_8_ + (long)&pvVar122->count;
  local_158 = 0;
  iStack_174 = 0;
  stack0xfffffffffffffe7c = (undefined1  [16])0x0;
  *(int *)(local_170._0_8_ + 0x20) = 1;
  *(int *)(uVar5 + 0x20) = 2;
  pVVar115 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar112 = local_f0;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar115,(Context *)local_f0[1]._vptr_TestNode,(Spec *)local_190,"diff_buffer",
             "diff_buffer");
  tcu::TestNode::addChild(pTVar112,(TestNode *)pVVar115);
  if ((value_type *)uVar111 != (value_type *)0x0) {
    operator_delete((void *)uVar111,(long)local_108 - uVar111);
  }
  if ((pointer)local_130._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_130._0_8_,(long)local_120 - local_130._0_8_);
  }
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,(long)local_140 - uVar5);
  }
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,(long)local_160 - uVar4);
  }
  auVar113 = local_a8;
  local_190._0_4_ = -1;
  local_190._4_4_ = -1;
  local_190[8] = false;
  uStack_17c._0_4_ = 0xffffffff;
  local_190._12_8_ = 0xffffffff00000000;
  uStack_17c._4_4_ = 0xffffffff;
  iStack_174 = -1;
  local_170 = (undefined1  [16])0x0;
  local_160 = (pointer)0x0;
  local_158 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = 0xffffffff;
  local_b8._0_4_ = local_b8._1_4_ << 8;
  local_b8._4_8_ = 1;
  local_b8._12_4_ = 0x1406;
  local_a8._0_4_ = local_a8._1_4_ << 8;
  local_98 = local_98 & 0xffffffff00000000;
  local_a8._13_3_ = auVar113._13_3_;
  local_a8._0_13_ = ZEXT413((uint)local_a8._0_4_);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_118,(value_type *)local_b8);
  uVar111 = local_118._0_8_;
  *(undefined1 *)(int *)local_118._0_8_ = 1;
  *(undefined8 *)(local_118._0_8_ + 4) = 2;
  *(int *)(local_118._0_8_ + 0xc) = 0x1406;
  *(undefined1 *)(local_118._0_8_ + 0x10) = 0;
  *(undefined1 *)(local_118._0_8_ + 0x1c) = 0;
  *(undefined8 *)(local_118._0_8_ + 0x14) = 0;
  *(float *)(local_118._0_8_ + 0x20) = 1.4013e-45;
  local_100 = 0;
  pvVar116 = (value_type *)local_88;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_130,pvVar116);
  local_190[8] = false;
  local_190._0_4_ = 0x18;
  local_190._4_4_ = 0;
  uVar64 = local_118._8_8_;
  pvVar122 = (value_type *)(local_118._8_8_ - uVar111);
  uVar4 = local_150._0_8_;
  pvVar120 = (value_type *)((long)local_140 - local_150._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar121 = (value_type *)uVar111; pvVar121 != (value_type *)uVar64;
        pvVar121 = (value_type *)&pvVar121->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar121->floatRangeMin;
      uVar13._0_4_ = pvVar121->count;
      uVar13._4_4_ = pvVar121->size;
      iVar109 = pvVar121->componentCount;
      iVar110 = pvVar121->stride;
      uVar14._0_4_ = pvVar121->offset;
      uVar14._4_4_ = pvVar121->type;
      uVar15._0_4_ = pvVar121->intRangeMin;
      uVar15._4_4_ = pvVar121->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar14;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar14 >> 8);
      pAVar118->divisor = (int)((ulong)uVar14 >> 0x20);
      pAVar118->offset = (undefined4)uVar15;
      pAVar118->normalized = (char)((ulong)uVar15 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar15 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar13;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar13 >> 8);
      pAVar118->size = (int)((ulong)uVar13 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
      pvVar116 = pvVar120;
    }
    local_140 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_150._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_150._8_8_;
    pvVar120 = (value_type *)(local_150._8_8_ - local_150._0_8_);
    if (pvVar120 < pvVar122) {
      if (local_150._8_8_ != local_150._0_8_) {
        pvVar116 = (value_type *)uVar111;
        memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar120);
      }
      for (pvVar120 = (value_type *)((long)(int *)uVar111 + (long)&pvVar120->count);
          pvVar120 != (value_type *)uVar64; pvVar120 = (value_type *)&pvVar120->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar120->floatRangeMin;
        uVar16._0_4_ = pvVar120->count;
        uVar16._4_4_ = pvVar120->size;
        iVar109 = pvVar120->componentCount;
        iVar110 = pvVar120->stride;
        uVar17._0_4_ = pvVar120->offset;
        uVar17._4_4_ = pvVar120->type;
        uVar18._0_4_ = pvVar120->intRangeMin;
        uVar18._4_4_ = pvVar120->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar17;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar17 >> 8);
        pAVar118->divisor = (int)((ulong)uVar17 >> 0x20);
        pAVar118->offset = (undefined4)uVar18;
        pAVar118->normalized = (char)((ulong)uVar18 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar18 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar16;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar16 >> 8);
        pAVar118->size = (int)((ulong)uVar16 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (local_118._8_8_ != uVar111) {
      pvVar116 = (value_type *)uVar111;
      memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar5 = local_150._0_8_;
  local_150._8_8_ = local_150._0_8_ + (long)pvVar122;
  local_138 = 0;
  uVar4 = local_170._0_8_;
  pvVar120 = (value_type *)((long)local_160 - local_170._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar116 = (value_type *)uVar111; pvVar116 != (value_type *)uVar64;
        pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
      uVar19._0_4_ = pvVar116->count;
      uVar19._4_4_ = pvVar116->size;
      iVar109 = pvVar116->componentCount;
      iVar110 = pvVar116->stride;
      uVar20._0_4_ = pvVar116->offset;
      uVar20._4_4_ = pvVar116->type;
      uVar21._0_4_ = pvVar116->intRangeMin;
      uVar21._4_4_ = pvVar116->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar20;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar20 >> 8);
      pAVar118->divisor = (int)((ulong)uVar20 >> 0x20);
      pAVar118->offset = (undefined4)uVar21;
      pAVar118->normalized = (char)((ulong)uVar21 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar21 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar19;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar19 >> 8);
      pAVar118->size = (int)((ulong)uVar19 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
    }
    local_160 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_170._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_170._8_8_;
    pvVar116 = (value_type *)(local_170._8_8_ - local_170._0_8_);
    if (pvVar116 < pvVar122) {
      if (local_170._8_8_ != local_170._0_8_) {
        memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar116);
      }
      for (pvVar116 = (value_type *)((long)(int *)uVar111 + (long)&pvVar116->count);
          pvVar116 != (value_type *)uVar64; pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
        uVar22._0_4_ = pvVar116->count;
        uVar22._4_4_ = pvVar116->size;
        iVar109 = pvVar116->componentCount;
        iVar110 = pvVar116->stride;
        uVar23._0_4_ = pvVar116->offset;
        uVar23._4_4_ = pvVar116->type;
        uVar24._0_4_ = pvVar116->intRangeMin;
        uVar24._4_4_ = pvVar116->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar23;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar23 >> 8);
        pAVar118->divisor = (int)((ulong)uVar23 >> 0x20);
        pAVar118->offset = (undefined4)uVar24;
        pAVar118->normalized = (char)((ulong)uVar24 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar24 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar22;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar22 >> 8);
        pAVar118->size = (int)((ulong)uVar22 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (uVar64 != uVar111) {
      memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar4 = local_170._0_8_;
  local_170._8_8_ = (GLboolean *)local_170._0_8_ + (long)&pvVar122->count;
  local_158 = 0;
  iStack_174 = 0;
  stack0xfffffffffffffe7c = (undefined1  [16])0x0;
  *(GLint *)(local_170._0_8_ + 4) = 2;
  *(GLint *)(uVar5 + 4) = 3;
  pVVar115 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar112 = local_f0;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar115,(Context *)local_f0[1]._vptr_TestNode,(Spec *)local_190,"diff_size",
             "diff_size");
  tcu::TestNode::addChild(pTVar112,(TestNode *)pVVar115);
  if ((value_type *)uVar111 != (value_type *)0x0) {
    operator_delete((void *)uVar111,(long)local_108 - uVar111);
  }
  if ((pointer)local_130._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_130._0_8_,(long)local_120 - local_130._0_8_);
  }
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,(long)local_140 - uVar5);
  }
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,(long)local_160 - uVar4);
  }
  auVar113 = local_a8;
  local_190._0_4_ = -1;
  local_190._4_4_ = -1;
  local_190[8] = false;
  uStack_17c._0_4_ = 0xffffffff;
  local_190._12_8_ = 0xffffffff00000000;
  uStack_17c._4_4_ = 0xffffffff;
  iStack_174 = -1;
  local_170 = (undefined1  [16])0x0;
  local_160 = (pointer)0x0;
  local_158 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = 0xffffffff;
  local_b8._0_4_ = local_b8._1_4_ << 8;
  local_b8._4_8_ = 1;
  local_b8._12_4_ = 0x1406;
  local_a8._0_4_ = local_a8._1_4_ << 8;
  local_98 = local_98 & 0xffffffff00000000;
  local_a8._13_3_ = auVar113._13_3_;
  local_a8._0_13_ = ZEXT413((uint)local_a8._0_4_);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_118,(value_type *)local_b8);
  uVar111 = local_118._0_8_;
  *(undefined1 *)(int *)local_118._0_8_ = 1;
  *(undefined8 *)(local_118._0_8_ + 4) = 2;
  *(int *)(local_118._0_8_ + 0xc) = 0x1402;
  *(undefined1 *)(local_118._0_8_ + 0x10) = 0;
  *(undefined8 *)(local_118._0_8_ + 0x14) = 0;
  *(undefined1 *)(local_118._0_8_ + 0x1c) = 1;
  *(float *)(local_118._0_8_ + 0x20) = 1.4013e-45;
  local_100 = 0;
  pvVar116 = (value_type *)local_e8;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_130,pvVar116);
  local_190[8] = false;
  local_190._0_4_ = 0x18;
  local_190._4_4_ = 0;
  uVar64 = local_118._8_8_;
  pvVar122 = (value_type *)(local_118._8_8_ - uVar111);
  uVar4 = local_150._0_8_;
  pvVar120 = (value_type *)((long)local_140 - local_150._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar121 = (value_type *)uVar111; pvVar121 != (value_type *)uVar64;
        pvVar121 = (value_type *)&pvVar121->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar121->floatRangeMin;
      uVar25._0_4_ = pvVar121->count;
      uVar25._4_4_ = pvVar121->size;
      iVar109 = pvVar121->componentCount;
      iVar110 = pvVar121->stride;
      uVar26._0_4_ = pvVar121->offset;
      uVar26._4_4_ = pvVar121->type;
      uVar27._0_4_ = pvVar121->intRangeMin;
      uVar27._4_4_ = pvVar121->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar26;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar26 >> 8);
      pAVar118->divisor = (int)((ulong)uVar26 >> 0x20);
      pAVar118->offset = (undefined4)uVar27;
      pAVar118->normalized = (char)((ulong)uVar27 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar27 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar25;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar25 >> 8);
      pAVar118->size = (int)((ulong)uVar25 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
      pvVar116 = pvVar120;
    }
    local_140 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_150._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_150._8_8_;
    pvVar120 = (value_type *)(local_150._8_8_ - local_150._0_8_);
    if (pvVar120 < pvVar122) {
      if (local_150._8_8_ != local_150._0_8_) {
        pvVar116 = (value_type *)uVar111;
        memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar120);
      }
      for (pvVar120 = (value_type *)((long)(int *)uVar111 + (long)&pvVar120->count);
          pvVar120 != (value_type *)uVar64; pvVar120 = (value_type *)&pvVar120->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar120->floatRangeMin;
        uVar28._0_4_ = pvVar120->count;
        uVar28._4_4_ = pvVar120->size;
        iVar109 = pvVar120->componentCount;
        iVar110 = pvVar120->stride;
        uVar29._0_4_ = pvVar120->offset;
        uVar29._4_4_ = pvVar120->type;
        uVar30._0_4_ = pvVar120->intRangeMin;
        uVar30._4_4_ = pvVar120->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar29;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar29 >> 8);
        pAVar118->divisor = (int)((ulong)uVar29 >> 0x20);
        pAVar118->offset = (undefined4)uVar30;
        pAVar118->normalized = (char)((ulong)uVar30 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar30 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar28;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar28 >> 8);
        pAVar118->size = (int)((ulong)uVar28 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (local_118._8_8_ != uVar111) {
      pvVar116 = (value_type *)uVar111;
      memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar5 = local_150._0_8_;
  local_150._8_8_ = local_150._0_8_ + (long)pvVar122;
  local_138 = 0;
  uVar4 = local_170._0_8_;
  pvVar120 = (value_type *)((long)local_160 - local_170._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar116 = (value_type *)uVar111; pvVar116 != (value_type *)uVar64;
        pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
      uVar31._0_4_ = pvVar116->count;
      uVar31._4_4_ = pvVar116->size;
      iVar109 = pvVar116->componentCount;
      iVar110 = pvVar116->stride;
      uVar32._0_4_ = pvVar116->offset;
      uVar32._4_4_ = pvVar116->type;
      uVar33._0_4_ = pvVar116->intRangeMin;
      uVar33._4_4_ = pvVar116->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar32;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar32 >> 8);
      pAVar118->divisor = (int)((ulong)uVar32 >> 0x20);
      pAVar118->offset = (undefined4)uVar33;
      pAVar118->normalized = (char)((ulong)uVar33 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar33 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar31;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar31 >> 8);
      pAVar118->size = (int)((ulong)uVar31 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
    }
    local_160 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_170._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_170._8_8_;
    pvVar116 = (value_type *)(local_170._8_8_ - local_170._0_8_);
    if (pvVar116 < pvVar122) {
      if (local_170._8_8_ != local_170._0_8_) {
        memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar116);
      }
      for (pvVar116 = (value_type *)((long)(int *)uVar111 + (long)&pvVar116->count);
          pvVar116 != (value_type *)uVar64; pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
        uVar34._0_4_ = pvVar116->count;
        uVar34._4_4_ = pvVar116->size;
        iVar109 = pvVar116->componentCount;
        iVar110 = pvVar116->stride;
        uVar35._0_4_ = pvVar116->offset;
        uVar35._4_4_ = pvVar116->type;
        uVar36._0_4_ = pvVar116->intRangeMin;
        uVar36._4_4_ = pvVar116->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar35;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar35 >> 8);
        pAVar118->divisor = (int)((ulong)uVar35 >> 0x20);
        pAVar118->offset = (undefined4)uVar36;
        pAVar118->normalized = (char)((ulong)uVar36 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar36 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar34;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar34 >> 8);
        pAVar118->size = (int)((ulong)uVar34 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (uVar64 != uVar111) {
      memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar4 = local_170._0_8_;
  local_170._8_8_ = (GLboolean *)local_170._0_8_ + (long)&pvVar122->count;
  local_158 = 0;
  iStack_174 = 0;
  stack0xfffffffffffffe7c = (undefined1  [16])0x0;
  *(GLint *)(uVar5 + 8) = 2;
  *(GLint *)(local_170._0_8_ + 8) = 4;
  pVVar115 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar112 = local_f0;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar115,(Context *)local_f0[1]._vptr_TestNode,(Spec *)local_190,"diff_stride",
             "diff_stride");
  tcu::TestNode::addChild(pTVar112,(TestNode *)pVVar115);
  if ((value_type *)uVar111 != (value_type *)0x0) {
    operator_delete((void *)uVar111,(long)local_108 - uVar111);
  }
  if ((pointer)local_130._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_130._0_8_,(long)local_120 - local_130._0_8_);
  }
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,(long)local_140 - uVar5);
  }
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,(long)local_160 - uVar4);
  }
  auVar113 = local_a8;
  local_190._0_4_ = -1;
  local_190._4_4_ = -1;
  local_190[8] = false;
  uStack_17c._0_4_ = 0xffffffff;
  local_190._12_8_ = 0xffffffff00000000;
  uStack_17c._4_4_ = 0xffffffff;
  iStack_174 = -1;
  local_170 = (undefined1  [16])0x0;
  local_160 = (pointer)0x0;
  local_158 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = 0xffffffff;
  local_b8._0_4_ = local_b8._1_4_ << 8;
  local_b8._4_8_ = 1;
  local_b8._12_4_ = 0x1406;
  local_a8._0_4_ = local_a8._1_4_ << 8;
  local_98 = local_98 & 0xffffffff00000000;
  local_a8._13_3_ = auVar113._13_3_;
  local_a8._0_13_ = ZEXT413((uint)local_a8._0_4_);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_118,(value_type *)local_b8);
  uVar111 = local_118._0_8_;
  *(undefined1 *)(int *)local_118._0_8_ = 1;
  *(undefined8 *)(local_118._0_8_ + 4) = 2;
  *(int *)(local_118._0_8_ + 0xc) = 0x1402;
  *(undefined1 *)(local_118._0_8_ + 0x10) = 0;
  *(undefined8 *)(local_118._0_8_ + 0x14) = 0;
  *(undefined1 *)(local_118._0_8_ + 0x1c) = 1;
  *(float *)(local_118._0_8_ + 0x20) = 1.4013e-45;
  local_100 = 0;
  pvVar116 = (value_type *)local_e8;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_130,pvVar116);
  local_190[8] = false;
  local_190._0_4_ = 0x18;
  local_190._4_4_ = 0;
  uVar64 = local_118._8_8_;
  pvVar122 = (value_type *)(local_118._8_8_ - uVar111);
  uVar4 = local_150._0_8_;
  pvVar120 = (value_type *)((long)local_140 - local_150._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar121 = (value_type *)uVar111; pvVar121 != (value_type *)uVar64;
        pvVar121 = (value_type *)&pvVar121->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar121->floatRangeMin;
      uVar37._0_4_ = pvVar121->count;
      uVar37._4_4_ = pvVar121->size;
      iVar109 = pvVar121->componentCount;
      iVar110 = pvVar121->stride;
      uVar38._0_4_ = pvVar121->offset;
      uVar38._4_4_ = pvVar121->type;
      uVar39._0_4_ = pvVar121->intRangeMin;
      uVar39._4_4_ = pvVar121->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar38;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar38 >> 8);
      pAVar118->divisor = (int)((ulong)uVar38 >> 0x20);
      pAVar118->offset = (undefined4)uVar39;
      pAVar118->normalized = (char)((ulong)uVar39 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar39 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar37;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar37 >> 8);
      pAVar118->size = (int)((ulong)uVar37 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
      pvVar116 = pvVar120;
    }
    local_140 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_150._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_150._8_8_;
    pvVar120 = (value_type *)(local_150._8_8_ - local_150._0_8_);
    if (pvVar120 < pvVar122) {
      if (local_150._8_8_ != local_150._0_8_) {
        pvVar116 = (value_type *)uVar111;
        memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar120);
      }
      for (pvVar120 = (value_type *)((long)(int *)uVar111 + (long)&pvVar120->count);
          pvVar120 != (value_type *)uVar64; pvVar120 = (value_type *)&pvVar120->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar120->floatRangeMin;
        uVar40._0_4_ = pvVar120->count;
        uVar40._4_4_ = pvVar120->size;
        iVar109 = pvVar120->componentCount;
        iVar110 = pvVar120->stride;
        uVar41._0_4_ = pvVar120->offset;
        uVar41._4_4_ = pvVar120->type;
        uVar42._0_4_ = pvVar120->intRangeMin;
        uVar42._4_4_ = pvVar120->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar41;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar41 >> 8);
        pAVar118->divisor = (int)((ulong)uVar41 >> 0x20);
        pAVar118->offset = (undefined4)uVar42;
        pAVar118->normalized = (char)((ulong)uVar42 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar42 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar40;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar40 >> 8);
        pAVar118->size = (int)((ulong)uVar40 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (local_118._8_8_ != uVar111) {
      pvVar116 = (value_type *)uVar111;
      memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar5 = local_150._0_8_;
  local_150._8_8_ = local_150._0_8_ + (long)pvVar122;
  local_138 = 0;
  uVar4 = local_170._0_8_;
  pvVar120 = (value_type *)((long)local_160 - local_170._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar116 = (value_type *)uVar111; pvVar116 != (value_type *)uVar64;
        pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
      uVar43._0_4_ = pvVar116->count;
      uVar43._4_4_ = pvVar116->size;
      iVar109 = pvVar116->componentCount;
      iVar110 = pvVar116->stride;
      uVar44._0_4_ = pvVar116->offset;
      uVar44._4_4_ = pvVar116->type;
      uVar45._0_4_ = pvVar116->intRangeMin;
      uVar45._4_4_ = pvVar116->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar44;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar44 >> 8);
      pAVar118->divisor = (int)((ulong)uVar44 >> 0x20);
      pAVar118->offset = (undefined4)uVar45;
      pAVar118->normalized = (char)((ulong)uVar45 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar45 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar43;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar43 >> 8);
      pAVar118->size = (int)((ulong)uVar43 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
    }
    local_160 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_170._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_170._8_8_;
    pvVar116 = (value_type *)(local_170._8_8_ - local_170._0_8_);
    if (pvVar116 < pvVar122) {
      if (local_170._8_8_ != local_170._0_8_) {
        memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar116);
      }
      for (pvVar116 = (value_type *)((long)(int *)uVar111 + (long)&pvVar116->count);
          pvVar116 != (value_type *)uVar64; pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
        uVar46._0_4_ = pvVar116->count;
        uVar46._4_4_ = pvVar116->size;
        iVar109 = pvVar116->componentCount;
        iVar110 = pvVar116->stride;
        uVar47._0_4_ = pvVar116->offset;
        uVar47._4_4_ = pvVar116->type;
        uVar48._0_4_ = pvVar116->intRangeMin;
        uVar48._4_4_ = pvVar116->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar47;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar47 >> 8);
        pAVar118->divisor = (int)((ulong)uVar47 >> 0x20);
        pAVar118->offset = (undefined4)uVar48;
        pAVar118->normalized = (char)((ulong)uVar48 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar48 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar46;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar46 >> 8);
        pAVar118->size = (int)((ulong)uVar46 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (uVar64 != uVar111) {
      memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar4 = local_170._0_8_;
  local_170._8_8_ = (GLboolean *)local_170._0_8_ + (long)&pvVar122->count;
  local_158 = 0;
  iStack_174 = 0;
  stack0xfffffffffffffe7c = (undefined1  [16])0x0;
  *(GLenum *)(uVar5 + 0xc) = 0x1402;
  *(GLenum *)(local_170._0_8_ + 0xc) = 0x1400;
  pVVar115 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar112 = local_f0;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar115,(Context *)local_f0[1]._vptr_TestNode,(Spec *)local_190,"diff_type",
             "diff_type");
  tcu::TestNode::addChild(pTVar112,(TestNode *)pVVar115);
  if ((value_type *)uVar111 != (value_type *)0x0) {
    operator_delete((void *)uVar111,(long)local_108 - uVar111);
  }
  if ((pointer)local_130._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_130._0_8_,(long)local_120 - local_130._0_8_);
  }
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,(long)local_140 - uVar5);
  }
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,(long)local_160 - uVar4);
  }
  auVar113 = local_a8;
  local_190._0_4_ = -1;
  local_190._4_4_ = -1;
  local_190[8] = false;
  uStack_17c._0_4_ = 0xffffffff;
  local_190._12_8_ = 0xffffffff00000000;
  uStack_17c._4_4_ = 0xffffffff;
  iStack_174 = -1;
  local_170 = (undefined1  [16])0x0;
  local_160 = (pointer)0x0;
  local_158 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = 0xffffffff;
  local_b8._0_4_ = local_b8._1_4_ << 8;
  local_b8._4_8_ = 1;
  local_b8._12_4_ = 0x1406;
  local_a8._0_4_ = local_a8._1_4_ << 8;
  local_98 = local_98 & 0xffffffff00000000;
  local_a8._13_3_ = auVar113._13_3_;
  local_a8._0_13_ = ZEXT413((uint)local_a8._0_4_);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_118,(value_type *)local_b8);
  uVar111 = local_118._0_8_;
  *(undefined1 *)(int *)local_118._0_8_ = 1;
  *(undefined8 *)(local_118._0_8_ + 4) = 2;
  *(int *)(local_118._0_8_ + 0xc) = 0x1400;
  *(undefined1 *)(local_118._0_8_ + 0x10) = 1;
  *(undefined8 *)(local_118._0_8_ + 0x14) = 0;
  *(undefined1 *)(local_118._0_8_ + 0x1c) = 0;
  *(float *)(local_118._0_8_ + 0x20) = 1.4013e-45;
  local_100 = 0;
  pvVar116 = (value_type *)local_e8;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_130,pvVar116);
  local_190[8] = false;
  local_190._0_4_ = 0x18;
  uVar64 = local_118._8_8_;
  pvVar122 = (value_type *)(local_118._8_8_ - uVar111);
  uVar4 = local_150._0_8_;
  pvVar120 = (value_type *)((long)local_140 - local_150._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar121 = (value_type *)uVar111; pvVar121 != (value_type *)uVar64;
        pvVar121 = (value_type *)&pvVar121->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar121->floatRangeMin;
      uVar49._0_4_ = pvVar121->count;
      uVar49._4_4_ = pvVar121->size;
      iVar109 = pvVar121->componentCount;
      iVar110 = pvVar121->stride;
      uVar50._0_4_ = pvVar121->offset;
      uVar50._4_4_ = pvVar121->type;
      uVar51._0_4_ = pvVar121->intRangeMin;
      uVar51._4_4_ = pvVar121->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar50;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar50 >> 8);
      pAVar118->divisor = (int)((ulong)uVar50 >> 0x20);
      pAVar118->offset = (undefined4)uVar51;
      pAVar118->normalized = (char)((ulong)uVar51 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar51 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar49;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar49 >> 8);
      pAVar118->size = (int)((ulong)uVar49 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
      pvVar116 = pvVar120;
    }
    local_140 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_150._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_150._8_8_;
    pvVar120 = (value_type *)(local_150._8_8_ - local_150._0_8_);
    if (pvVar120 < pvVar122) {
      if (local_150._8_8_ != local_150._0_8_) {
        pvVar116 = (value_type *)uVar111;
        memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar120);
      }
      for (pvVar120 = (value_type *)((long)(int *)uVar111 + (long)&pvVar120->count);
          pvVar120 != (value_type *)uVar64; pvVar120 = (value_type *)&pvVar120->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar120->floatRangeMin;
        uVar52._0_4_ = pvVar120->count;
        uVar52._4_4_ = pvVar120->size;
        iVar109 = pvVar120->componentCount;
        iVar110 = pvVar120->stride;
        uVar53._0_4_ = pvVar120->offset;
        uVar53._4_4_ = pvVar120->type;
        uVar54._0_4_ = pvVar120->intRangeMin;
        uVar54._4_4_ = pvVar120->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar53;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar53 >> 8);
        pAVar118->divisor = (int)((ulong)uVar53 >> 0x20);
        pAVar118->offset = (undefined4)uVar54;
        pAVar118->normalized = (char)((ulong)uVar54 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar54 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar52;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar52 >> 8);
        pAVar118->size = (int)((ulong)uVar52 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (local_118._8_8_ != uVar111) {
      pvVar116 = (value_type *)uVar111;
      memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar5 = local_150._0_8_;
  local_150._8_8_ = local_150._0_8_ + (long)pvVar122;
  local_138 = 0;
  uVar4 = local_170._0_8_;
  pvVar120 = (value_type *)((long)local_160 - local_170._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar116 = (value_type *)uVar111; pvVar116 != (value_type *)uVar64;
        pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
      uVar55._0_4_ = pvVar116->count;
      uVar55._4_4_ = pvVar116->size;
      iVar109 = pvVar116->componentCount;
      iVar110 = pvVar116->stride;
      uVar56._0_4_ = pvVar116->offset;
      uVar56._4_4_ = pvVar116->type;
      uVar57._0_4_ = pvVar116->intRangeMin;
      uVar57._4_4_ = pvVar116->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar56;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar56 >> 8);
      pAVar118->divisor = (int)((ulong)uVar56 >> 0x20);
      pAVar118->offset = (undefined4)uVar57;
      pAVar118->normalized = (char)((ulong)uVar57 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar57 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar55;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar55 >> 8);
      pAVar118->size = (int)((ulong)uVar55 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
    }
    local_160 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_170._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_170._8_8_;
    pvVar116 = (value_type *)(local_170._8_8_ - local_170._0_8_);
    if (pvVar116 < pvVar122) {
      if (local_170._8_8_ != local_170._0_8_) {
        memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar116);
      }
      for (pvVar116 = (value_type *)((long)(int *)uVar111 + (long)&pvVar116->count);
          pvVar116 != (value_type *)uVar64; pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
        uVar58._0_4_ = pvVar116->count;
        uVar58._4_4_ = pvVar116->size;
        iVar109 = pvVar116->componentCount;
        iVar110 = pvVar116->stride;
        uVar59._0_4_ = pvVar116->offset;
        uVar59._4_4_ = pvVar116->type;
        uVar60._0_4_ = pvVar116->intRangeMin;
        uVar60._4_4_ = pvVar116->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar59;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar59 >> 8);
        pAVar118->divisor = (int)((ulong)uVar59 >> 0x20);
        pAVar118->offset = (undefined4)uVar60;
        pAVar118->normalized = (char)((ulong)uVar60 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar60 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar58;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar58 >> 8);
        pAVar118->size = (int)((ulong)uVar58 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (uVar64 != uVar111) {
      memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar4 = local_170._0_8_;
  local_170._8_8_ = (GLboolean *)local_170._0_8_ + (long)&pvVar122->count;
  local_158 = 0;
  local_190._0_8_ = local_190._0_8_ & 0xffffffff;
  iStack_174 = 0;
  stack0xfffffffffffffe7c = (undefined1  [16])0x0;
  *(GLboolean *)(local_170._0_8_ + 0x10) = '\0';
  *(GLboolean *)(uVar5 + 0x10) = '\x01';
  pVVar115 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar112 = local_f0;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar115,(Context *)local_f0[1]._vptr_TestNode,(Spec *)local_190,"diff_integer",
             "diff_integer");
  tcu::TestNode::addChild(pTVar112,(TestNode *)pVVar115);
  if ((value_type *)uVar111 != (value_type *)0x0) {
    operator_delete((void *)uVar111,(long)local_108 - uVar111);
  }
  if ((pointer)local_130._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_130._0_8_,(long)local_120 - local_130._0_8_);
  }
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,(long)local_140 - uVar5);
  }
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,(long)local_160 - uVar4);
  }
  auVar113 = local_a8;
  local_190._0_4_ = -1;
  local_190._4_4_ = -1;
  local_190[8] = false;
  uStack_17c._0_4_ = 0xffffffff;
  local_190._12_8_ = 0xffffffff00000000;
  uStack_17c._4_4_ = 0xffffffff;
  iStack_174 = -1;
  local_170 = (undefined1  [16])0x0;
  local_160 = (pointer)0x0;
  local_158 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = 0xffffffff;
  local_b8._0_4_ = local_b8._1_4_ << 8;
  local_b8._4_8_ = 1;
  local_b8._12_4_ = 0x1406;
  local_a8._0_4_ = local_a8._1_4_ << 8;
  local_98 = local_98 & 0xffffffff00000000;
  local_a8._13_3_ = auVar113._13_3_;
  local_a8._0_13_ = ZEXT413((uint)local_a8._0_4_);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_118,(value_type *)local_b8);
  auVar113 = local_a8;
  local_b8._0_4_ = local_b8._1_4_ << 8;
  local_b8._4_8_ = 1;
  local_b8._12_4_ = 0x1406;
  local_a8._0_12_ = local_a8._1_12_ << 8;
  local_98 = local_98 & 0xffffffff00000000;
  local_a8._13_3_ = auVar113._13_3_;
  local_a8[0xc] = 0;
  local_a8._4_8_ = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_118,(value_type *)local_b8);
  pvVar120 = (value_type *)local_118._0_8_;
  *(undefined1 *)(int *)local_118._0_8_ = 1;
  *(undefined8 *)(local_118._0_8_ + 4) = 2;
  *(int *)(local_118._0_8_ + 0xc) = 0x1402;
  *(undefined1 *)(local_118._0_8_ + 0x10) = 0;
  *(undefined8 *)(local_118._0_8_ + 0x14) = 0;
  *(undefined1 *)(local_118._0_8_ + 0x1c) = 1;
  *(float *)(local_118._0_8_ + 0x20) = 1.4013e-45;
  *(undefined1 *)(local_118._0_8_ + 0x24) = 1;
  ((value_type *)(local_118._0_8_ + 0x28))->count = 4;
  ((value_type *)(local_118._0_8_ + 0x28))->size = 0;
  ((value_type *)(local_118._0_8_ + 0x28))->componentCount = 0x1406;
  *(undefined1 *)&((value_type *)(local_118._0_8_ + 0x28))->stride = 0;
  ((value_type *)(local_118._0_8_ + 0x28))->offset = 0;
  ((value_type *)(local_118._0_8_ + 0x28))->type = 0;
  *(undefined1 *)&((value_type *)(local_118._0_8_ + 0x28))->intRangeMin = 0;
  ((value_type *)(local_118._0_8_ + 0x28))->intRangeMax = 2;
  local_100 = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_130,(value_type *)local_e8);
  pvVar116 = (value_type *)local_88;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_130,pvVar116);
  local_190[8] = false;
  local_190._0_4_ = 0xc;
  local_190._4_4_ = 10;
  uVar111 = local_118._8_8_;
  pvVar122 = (value_type *)(local_118._8_8_ - (long)pvVar120);
  uVar4 = local_150._0_8_;
  pvVar121 = (value_type *)((long)local_140 - local_150._0_8_);
  if (pvVar121 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (; pvVar120 != (value_type *)uVar111; pvVar120 = (value_type *)&pvVar120->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar120->floatRangeMin;
      uVar61._0_4_ = pvVar120->count;
      uVar61._4_4_ = pvVar120->size;
      iVar109 = pvVar120->componentCount;
      iVar110 = pvVar120->stride;
      uVar62._0_4_ = pvVar120->offset;
      uVar62._4_4_ = pvVar120->type;
      uVar63._0_4_ = pvVar120->intRangeMin;
      uVar63._4_4_ = pvVar120->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar62;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar62 >> 8);
      pAVar118->divisor = (int)((ulong)uVar62 >> 0x20);
      pAVar118->offset = (undefined4)uVar63;
      pAVar118->normalized = (char)((ulong)uVar63 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar63 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar61;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar61 >> 8);
      pAVar118->size = (int)((ulong)uVar61 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar121);
      pvVar116 = pvVar121;
    }
    local_140 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_150._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_150._8_8_;
    pvVar121 = (value_type *)(local_150._8_8_ - local_150._0_8_);
    if (pvVar121 < pvVar122) {
      if (local_150._8_8_ != local_150._0_8_) {
        pvVar116 = pvVar120;
        memmove((void *)local_150._0_8_,pvVar120,(size_t)pvVar121);
      }
      for (pvVar120 = (value_type *)((long)pvVar120 + (long)pvVar121);
          pvVar120 != (value_type *)uVar111; pvVar120 = (value_type *)&pvVar120->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar120->floatRangeMin;
        uVar64._0_4_ = pvVar120->count;
        uVar64._4_4_ = pvVar120->size;
        iVar109 = pvVar120->componentCount;
        iVar110 = pvVar120->stride;
        uVar65._0_4_ = pvVar120->offset;
        uVar65._4_4_ = pvVar120->type;
        uVar66._0_4_ = pvVar120->intRangeMin;
        uVar66._4_4_ = pvVar120->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar65;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar65 >> 8);
        pAVar118->divisor = (int)((ulong)uVar65 >> 0x20);
        pAVar118->offset = (undefined4)uVar66;
        pAVar118->normalized = (char)((ulong)uVar66 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar66 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar64;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar64 >> 8);
        pAVar118->size = (int)((ulong)uVar64 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if ((value_type *)local_118._8_8_ != pvVar120) {
      memmove((void *)local_150._0_8_,pvVar120,(size_t)pvVar122);
      pvVar116 = pvVar120;
    }
  }
  uVar64 = local_150._0_8_;
  local_150._8_8_ = (GLboolean *)local_150._0_8_ + (long)&pvVar122->count;
  local_138 = 0;
  uVar5 = local_118._0_8_;
  uVar119 = uVar111 - local_118._0_8_;
  uVar4 = local_170._0_8_;
  uVar117 = (long)local_160 - local_170._0_8_;
  if (uVar117 < uVar119) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)uVar119 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar116 = (value_type *)uVar5; pvVar116 != (value_type *)uVar111;
        pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
      uVar67._0_4_ = pvVar116->count;
      uVar67._4_4_ = pvVar116->size;
      iVar109 = pvVar116->componentCount;
      iVar110 = pvVar116->stride;
      uVar68._0_4_ = pvVar116->offset;
      uVar68._4_4_ = pvVar116->type;
      uVar69._0_4_ = pvVar116->intRangeMin;
      uVar69._4_4_ = pvVar116->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar68;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar68 >> 8);
      pAVar118->divisor = (int)((ulong)uVar68 >> 0x20);
      pAVar118->offset = (undefined4)uVar69;
      pAVar118->normalized = (char)((ulong)uVar69 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar69 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar67;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar67 >> 8);
      pAVar118->size = (int)((ulong)uVar67 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,uVar117);
    }
    local_160 = (pointer)((long)pAVar114 + uVar119);
    local_170._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_170._8_8_;
    uVar117 = local_170._8_8_ - local_170._0_8_;
    if (uVar117 < uVar119) {
      if (local_170._8_8_ != local_170._0_8_) {
        memmove((void *)local_170._0_8_,(void *)local_118._0_8_,uVar117);
      }
      for (pvVar116 = (value_type *)(uVar117 + uVar5); pvVar116 != (value_type *)uVar111;
          pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
        uVar70._0_4_ = pvVar116->count;
        uVar70._4_4_ = pvVar116->size;
        iVar109 = pvVar116->componentCount;
        iVar110 = pvVar116->stride;
        uVar71._0_4_ = pvVar116->offset;
        uVar71._4_4_ = pvVar116->type;
        uVar72._0_4_ = pvVar116->intRangeMin;
        uVar72._4_4_ = pvVar116->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar71;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar71 >> 8);
        pAVar118->divisor = (int)((ulong)uVar71 >> 0x20);
        pAVar118->offset = (undefined4)uVar72;
        pAVar118->normalized = (char)((ulong)uVar72 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar72 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar70;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar70 >> 8);
        pAVar118->size = (int)((ulong)uVar70 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (uVar111 != local_118._0_8_) {
      memmove((void *)local_170._0_8_,(void *)local_118._0_8_,uVar119);
    }
  }
  uVar4 = local_170._0_8_;
  local_170._8_8_ = uVar119 + local_170._0_8_;
  local_158 = 0;
  iStack_174 = 0;
  stack0xfffffffffffffe7c = (undefined1  [16])0x0;
  ((pointer)(uVar64 + 0x24))->divisor = 3;
  ((pointer)(local_170._0_8_ + 0x24))->divisor = 2;
  pVVar115 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar112 = local_f0;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar115,(Context *)local_f0[1]._vptr_TestNode,(Spec *)local_190,"diff_divisor",
             "diff_divisor");
  tcu::TestNode::addChild(pTVar112,(TestNode *)pVVar115);
  if ((value_type *)uVar5 != (value_type *)0x0) {
    operator_delete((void *)uVar5,(long)local_108 - uVar5);
  }
  if ((pointer)local_130._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_130._0_8_,(long)local_120 - local_130._0_8_);
  }
  if ((pointer)uVar64 != (pointer)0x0) {
    operator_delete((void *)uVar64,(long)local_140 - uVar64);
  }
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,(long)local_160 - uVar4);
  }
  auVar113 = local_a8;
  local_190._0_4_ = -1;
  local_190._4_4_ = -1;
  local_190[8] = false;
  uStack_17c._0_4_ = 0xffffffff;
  local_190._12_8_ = 0xffffffff00000000;
  uStack_17c._4_4_ = 0xffffffff;
  iStack_174 = -1;
  local_170 = (undefined1  [16])0x0;
  local_160 = (pointer)0x0;
  local_158 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = 0xffffffff;
  local_b8._0_4_ = local_b8._1_4_ << 8;
  local_b8._4_8_ = 1;
  local_b8._12_4_ = 0x1406;
  local_a8._0_4_ = local_a8._1_4_ << 8;
  local_98 = local_98 & 0xffffffff00000000;
  local_a8._13_3_ = auVar113._13_3_;
  local_a8._0_13_ = ZEXT413((uint)local_a8._0_4_);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_118,(value_type *)local_b8);
  uVar111 = local_118._0_8_;
  *(undefined1 *)(int *)local_118._0_8_ = 1;
  *(undefined8 *)(local_118._0_8_ + 4) = 2;
  *(int *)(local_118._0_8_ + 0xc) = 0x1402;
  *(undefined1 *)(local_118._0_8_ + 0x10) = 0;
  *(undefined8 *)(local_118._0_8_ + 0x14) = 0;
  *(undefined1 *)(local_118._0_8_ + 0x1c) = 1;
  *(float *)(local_118._0_8_ + 0x20) = 1.4013e-45;
  local_100 = 0;
  pvVar116 = (value_type *)local_e8;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_130,pvVar116);
  local_190[8] = false;
  local_190._0_4_ = 0x18;
  local_190._4_4_ = 0;
  uVar64 = local_118._8_8_;
  pvVar122 = (value_type *)(local_118._8_8_ - uVar111);
  uVar4 = local_150._0_8_;
  pvVar120 = (value_type *)((long)local_140 - local_150._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar121 = (value_type *)uVar111; pvVar121 != (value_type *)uVar64;
        pvVar121 = (value_type *)&pvVar121->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar121->floatRangeMin;
      uVar73._0_4_ = pvVar121->count;
      uVar73._4_4_ = pvVar121->size;
      iVar109 = pvVar121->componentCount;
      iVar110 = pvVar121->stride;
      uVar74._0_4_ = pvVar121->offset;
      uVar74._4_4_ = pvVar121->type;
      uVar75._0_4_ = pvVar121->intRangeMin;
      uVar75._4_4_ = pvVar121->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar74;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar74 >> 8);
      pAVar118->divisor = (int)((ulong)uVar74 >> 0x20);
      pAVar118->offset = (undefined4)uVar75;
      pAVar118->normalized = (char)((ulong)uVar75 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar75 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar73;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar73 >> 8);
      pAVar118->size = (int)((ulong)uVar73 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
      pvVar116 = pvVar120;
    }
    local_140 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_150._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_150._8_8_;
    pvVar120 = (value_type *)(local_150._8_8_ - local_150._0_8_);
    if (pvVar120 < pvVar122) {
      if (local_150._8_8_ != local_150._0_8_) {
        pvVar116 = (value_type *)uVar111;
        memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar120);
      }
      for (pvVar120 = (value_type *)((long)(int *)uVar111 + (long)&pvVar120->count);
          pvVar120 != (value_type *)uVar64; pvVar120 = (value_type *)&pvVar120->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar120->floatRangeMin;
        uVar76._0_4_ = pvVar120->count;
        uVar76._4_4_ = pvVar120->size;
        iVar109 = pvVar120->componentCount;
        iVar110 = pvVar120->stride;
        uVar77._0_4_ = pvVar120->offset;
        uVar77._4_4_ = pvVar120->type;
        uVar78._0_4_ = pvVar120->intRangeMin;
        uVar78._4_4_ = pvVar120->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar77;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar77 >> 8);
        pAVar118->divisor = (int)((ulong)uVar77 >> 0x20);
        pAVar118->offset = (undefined4)uVar78;
        pAVar118->normalized = (char)((ulong)uVar78 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar78 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar76;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar76 >> 8);
        pAVar118->size = (int)((ulong)uVar76 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (local_118._8_8_ != uVar111) {
      pvVar116 = (value_type *)uVar111;
      memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar5 = local_150._0_8_;
  local_150._8_8_ = local_150._0_8_ + (long)pvVar122;
  local_138 = 0;
  uVar4 = local_170._0_8_;
  pvVar120 = (value_type *)((long)local_160 - local_170._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar116 = (value_type *)uVar111; pvVar116 != (value_type *)uVar64;
        pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
      uVar79._0_4_ = pvVar116->count;
      uVar79._4_4_ = pvVar116->size;
      iVar109 = pvVar116->componentCount;
      iVar110 = pvVar116->stride;
      uVar80._0_4_ = pvVar116->offset;
      uVar80._4_4_ = pvVar116->type;
      uVar81._0_4_ = pvVar116->intRangeMin;
      uVar81._4_4_ = pvVar116->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar80;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar80 >> 8);
      pAVar118->divisor = (int)((ulong)uVar80 >> 0x20);
      pAVar118->offset = (undefined4)uVar81;
      pAVar118->normalized = (char)((ulong)uVar81 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar81 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar79;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar79 >> 8);
      pAVar118->size = (int)((ulong)uVar79 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
    }
    local_160 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_170._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_170._8_8_;
    pvVar116 = (value_type *)(local_170._8_8_ - local_170._0_8_);
    if (pvVar116 < pvVar122) {
      if (local_170._8_8_ != local_170._0_8_) {
        memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar116);
      }
      for (pvVar116 = (value_type *)((long)(int *)uVar111 + (long)&pvVar116->count);
          pvVar116 != (value_type *)uVar64; pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
        uVar82._0_4_ = pvVar116->count;
        uVar82._4_4_ = pvVar116->size;
        iVar109 = pvVar116->componentCount;
        iVar110 = pvVar116->stride;
        uVar83._0_4_ = pvVar116->offset;
        uVar83._4_4_ = pvVar116->type;
        uVar84._0_4_ = pvVar116->intRangeMin;
        uVar84._4_4_ = pvVar116->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar83;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar83 >> 8);
        pAVar118->divisor = (int)((ulong)uVar83 >> 0x20);
        pAVar118->offset = (undefined4)uVar84;
        pAVar118->normalized = (char)((ulong)uVar84 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar84 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar82;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar82 >> 8);
        pAVar118->size = (int)((ulong)uVar82 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (uVar64 != uVar111) {
      memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar4 = local_170._0_8_;
  local_170._8_8_ = (GLboolean *)local_170._0_8_ + (long)&pvVar122->count;
  local_158 = 0;
  iStack_174 = 0;
  stack0xfffffffffffffe7c = (undefined1  [16])0x0;
  *(GLint *)(uVar5 + 0x18) = 2;
  *(GLint *)(local_170._0_8_ + 0x18) = 4;
  pVVar115 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar112 = local_f0;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar115,(Context *)local_f0[1]._vptr_TestNode,(Spec *)local_190,"diff_offset",
             "diff_offset");
  tcu::TestNode::addChild(pTVar112,(TestNode *)pVVar115);
  if ((value_type *)uVar111 != (value_type *)0x0) {
    operator_delete((void *)uVar111,(long)local_108 - uVar111);
  }
  if ((pointer)local_130._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_130._0_8_,(long)local_120 - local_130._0_8_);
  }
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,(long)local_140 - uVar5);
  }
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,(long)local_160 - uVar4);
  }
  auVar113 = local_a8;
  local_190._0_4_ = -1;
  local_190._4_4_ = -1;
  local_190[8] = false;
  uStack_17c._0_4_ = 0xffffffff;
  local_190._12_8_ = 0xffffffff00000000;
  uStack_17c._4_4_ = 0xffffffff;
  iStack_174 = -1;
  local_170 = (undefined1  [16])0x0;
  local_160 = (pointer)0x0;
  local_158 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = 0xffffffff;
  local_b8._0_4_ = local_b8._1_4_ << 8;
  local_b8._4_8_ = 1;
  local_b8._12_4_ = 0x1406;
  local_a8._0_4_ = local_a8._1_4_ << 8;
  local_98 = local_98 & 0xffffffff00000000;
  local_a8._13_3_ = auVar113._13_3_;
  local_a8._0_13_ = ZEXT413((uint)local_a8._0_4_);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_118,(value_type *)local_b8);
  uVar111 = local_118._0_8_;
  *(undefined1 *)(int *)local_118._0_8_ = 1;
  *(undefined8 *)(local_118._0_8_ + 4) = 2;
  *(int *)(local_118._0_8_ + 0xc) = 0x1402;
  *(undefined1 *)(local_118._0_8_ + 0x10) = 0;
  *(undefined8 *)(local_118._0_8_ + 0x14) = 0;
  *(undefined1 *)(local_118._0_8_ + 0x1c) = 1;
  *(float *)(local_118._0_8_ + 0x20) = 1.4013e-45;
  local_100 = 0;
  pvVar116 = (value_type *)local_e8;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_130,pvVar116);
  local_190[8] = false;
  local_190._0_4_ = 0x30;
  local_190._4_4_ = 0;
  uVar64 = local_118._8_8_;
  pvVar122 = (value_type *)(local_118._8_8_ - uVar111);
  uVar4 = local_150._0_8_;
  pvVar120 = (value_type *)((long)local_140 - local_150._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar121 = (value_type *)uVar111; pvVar121 != (value_type *)uVar64;
        pvVar121 = (value_type *)&pvVar121->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar121->floatRangeMin;
      uVar85._0_4_ = pvVar121->count;
      uVar85._4_4_ = pvVar121->size;
      iVar109 = pvVar121->componentCount;
      iVar110 = pvVar121->stride;
      uVar86._0_4_ = pvVar121->offset;
      uVar86._4_4_ = pvVar121->type;
      uVar87._0_4_ = pvVar121->intRangeMin;
      uVar87._4_4_ = pvVar121->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar86;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar86 >> 8);
      pAVar118->divisor = (int)((ulong)uVar86 >> 0x20);
      pAVar118->offset = (undefined4)uVar87;
      pAVar118->normalized = (char)((ulong)uVar87 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar87 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar85;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar85 >> 8);
      pAVar118->size = (int)((ulong)uVar85 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
      pvVar116 = pvVar120;
    }
    local_140 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_150._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_150._8_8_;
    pvVar120 = (value_type *)(local_150._8_8_ - local_150._0_8_);
    if (pvVar120 < pvVar122) {
      if (local_150._8_8_ != local_150._0_8_) {
        pvVar116 = (value_type *)uVar111;
        memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar120);
      }
      for (pvVar120 = (value_type *)((long)(int *)uVar111 + (long)&pvVar120->count);
          pvVar120 != (value_type *)uVar64; pvVar120 = (value_type *)&pvVar120->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar120->floatRangeMin;
        uVar88._0_4_ = pvVar120->count;
        uVar88._4_4_ = pvVar120->size;
        iVar109 = pvVar120->componentCount;
        iVar110 = pvVar120->stride;
        uVar89._0_4_ = pvVar120->offset;
        uVar89._4_4_ = pvVar120->type;
        uVar90._0_4_ = pvVar120->intRangeMin;
        uVar90._4_4_ = pvVar120->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar89;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar89 >> 8);
        pAVar118->divisor = (int)((ulong)uVar89 >> 0x20);
        pAVar118->offset = (undefined4)uVar90;
        pAVar118->normalized = (char)((ulong)uVar90 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar90 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar88;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar88 >> 8);
        pAVar118->size = (int)((ulong)uVar88 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (local_118._8_8_ != uVar111) {
      pvVar116 = (value_type *)uVar111;
      memmove((void *)local_150._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar5 = local_150._0_8_;
  local_150._8_8_ = local_150._0_8_ + (long)pvVar122;
  local_138 = 0;
  uVar4 = local_170._0_8_;
  pvVar120 = (value_type *)((long)local_160 - local_170._0_8_);
  if (pvVar120 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar116 = (value_type *)uVar111; pvVar116 != (value_type *)uVar64;
        pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
      uVar91._0_4_ = pvVar116->count;
      uVar91._4_4_ = pvVar116->size;
      iVar109 = pvVar116->componentCount;
      iVar110 = pvVar116->stride;
      uVar92._0_4_ = pvVar116->offset;
      uVar92._4_4_ = pvVar116->type;
      uVar93._0_4_ = pvVar116->intRangeMin;
      uVar93._4_4_ = pvVar116->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar92;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar92 >> 8);
      pAVar118->divisor = (int)((ulong)uVar92 >> 0x20);
      pAVar118->offset = (undefined4)uVar93;
      pAVar118->normalized = (char)((ulong)uVar93 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar93 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar91;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar91 >> 8);
      pAVar118->size = (int)((ulong)uVar91 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar120);
    }
    local_160 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_170._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_170._8_8_;
    pvVar116 = (value_type *)(local_170._8_8_ - local_170._0_8_);
    if (pvVar116 < pvVar122) {
      if (local_170._8_8_ != local_170._0_8_) {
        memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar116);
      }
      for (pvVar116 = (value_type *)((long)(int *)uVar111 + (long)&pvVar116->count);
          pvVar116 != (value_type *)uVar64; pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
        uVar94._0_4_ = pvVar116->count;
        uVar94._4_4_ = pvVar116->size;
        iVar109 = pvVar116->componentCount;
        iVar110 = pvVar116->stride;
        uVar95._0_4_ = pvVar116->offset;
        uVar95._4_4_ = pvVar116->type;
        uVar96._0_4_ = pvVar116->intRangeMin;
        uVar96._4_4_ = pvVar116->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar95;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar95 >> 8);
        pAVar118->divisor = (int)((ulong)uVar95 >> 0x20);
        pAVar118->offset = (undefined4)uVar96;
        pAVar118->normalized = (char)((ulong)uVar96 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar96 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar94;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar94 >> 8);
        pAVar118->size = (int)((ulong)uVar94 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (uVar64 != uVar111) {
      memmove((void *)local_170._0_8_,(void *)uVar111,(size_t)pvVar122);
    }
  }
  uVar4 = local_170._0_8_;
  local_170._8_8_ = (GLboolean *)local_170._0_8_ + (long)&pvVar122->count;
  local_158 = 0;
  iStack_174 = 0;
  stack0xfffffffffffffe7c = (undefined1  [16])0x0;
  *(GLboolean *)(uVar5 + 0x1c) = '\x01';
  *(GLboolean *)(local_170._0_8_ + 0x1c) = '\0';
  pVVar115 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar112 = local_f0;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar115,(Context *)local_f0[1]._vptr_TestNode,(Spec *)local_190,"diff_normalize",
             "diff_normalize");
  tcu::TestNode::addChild(pTVar112,(TestNode *)pVVar115);
  if ((value_type *)uVar111 != (value_type *)0x0) {
    operator_delete((void *)uVar111,(long)local_108 - uVar111);
  }
  if ((pointer)local_130._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_130._0_8_,(long)local_120 - local_130._0_8_);
  }
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,(long)local_140 - uVar5);
  }
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,(long)local_160 - uVar4);
  }
  auVar113 = local_a8;
  local_190._0_4_ = -1;
  local_190._4_4_ = -1;
  local_190[8] = false;
  uStack_17c._0_4_ = 0xffffffff;
  local_190._12_8_ = 0xffffffff00000000;
  uStack_17c._4_4_ = 0xffffffff;
  iStack_174 = -1;
  local_170 = (undefined1  [16])0x0;
  local_160 = (pointer)0x0;
  local_158 = -1;
  local_150 = (undefined1  [16])0x0;
  local_140 = (pointer)0x0;
  local_138 = -1;
  local_130 = (undefined1  [16])0x0;
  local_120 = (pointer)0x0;
  local_108 = (pointer)0x0;
  local_118 = (undefined1  [16])0x0;
  local_100 = 0xffffffff;
  local_b8._0_4_ = local_b8._1_4_ << 8;
  local_b8._4_8_ = 1;
  local_b8._12_4_ = 0x1406;
  local_a8._0_4_ = local_a8._1_4_ << 8;
  local_98 = local_98 & 0xffffffff00000000;
  local_a8._13_3_ = auVar113._13_3_;
  local_a8._0_13_ = ZEXT413((uint)local_a8._0_4_);
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               *)local_118,(value_type *)local_b8);
  pvVar120 = (value_type *)local_118._0_8_;
  *(undefined1 *)(int *)local_118._0_8_ = 1;
  *(undefined8 *)(local_118._0_8_ + 4) = 2;
  *(int *)(local_118._0_8_ + 0xc) = 0x1406;
  *(undefined1 *)(local_118._0_8_ + 0x10) = 0;
  *(undefined8 *)(local_118._0_8_ + 0x14) = 0;
  *(undefined1 *)(local_118._0_8_ + 0x1c) = 1;
  *(float *)(local_118._0_8_ + 0x20) = 1.4013e-45;
  local_100 = 0;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_130,(value_type *)local_88);
  pvVar116 = (value_type *)local_b8;
  local_98._0_4_ = 0.0;
  local_98._4_4_ = 0.0;
  local_b8._8_4_ = 1;
  local_b8._0_8_ = 0xc000000018;
  local_b8._12_4_ = 0;
  local_a8._0_12_ = ZEXT812(0x140300000000);
  local_a8._12_4_ = 0x30;
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
  ::push_back((vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               *)local_130,pvVar116);
  local_190[8] = true;
  local_190._0_4_ = 0x18;
  uVar111 = local_118._8_8_;
  pvVar122 = (value_type *)(local_118._8_8_ - (long)pvVar120);
  uVar4 = local_150._0_8_;
  pvVar121 = (value_type *)((long)local_140 - local_150._0_8_);
  if (pvVar121 < pvVar122) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)pvVar122 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (; pvVar120 != (value_type *)uVar111; pvVar120 = (value_type *)&pvVar120->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar120->floatRangeMin;
      uVar97._0_4_ = pvVar120->count;
      uVar97._4_4_ = pvVar120->size;
      iVar109 = pvVar120->componentCount;
      iVar110 = pvVar120->stride;
      uVar98._0_4_ = pvVar120->offset;
      uVar98._4_4_ = pvVar120->type;
      uVar99._0_4_ = pvVar120->intRangeMin;
      uVar99._4_4_ = pvVar120->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar98;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar98 >> 8);
      pAVar118->divisor = (int)((ulong)uVar98 >> 0x20);
      pAVar118->offset = (undefined4)uVar99;
      pAVar118->normalized = (char)((ulong)uVar99 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar99 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar97;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar97 >> 8);
      pAVar118->size = (int)((ulong)uVar97 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,(ulong)pvVar121);
      pvVar116 = pvVar121;
    }
    local_140 = (pointer)((long)pAVar114 + (long)pvVar122);
    local_150._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_150._8_8_;
    pvVar121 = (value_type *)(local_150._8_8_ - local_150._0_8_);
    if (pvVar121 < pvVar122) {
      if (local_150._8_8_ != local_150._0_8_) {
        pvVar116 = pvVar120;
        memmove((void *)local_150._0_8_,pvVar120,(size_t)pvVar121);
      }
      for (pvVar120 = (value_type *)((long)pvVar120 + (long)pvVar121);
          pvVar120 != (value_type *)uVar111; pvVar120 = (value_type *)&pvVar120->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar120->floatRangeMin;
        uVar100._0_4_ = pvVar120->count;
        uVar100._4_4_ = pvVar120->size;
        iVar109 = pvVar120->componentCount;
        iVar110 = pvVar120->stride;
        uVar101._0_4_ = pvVar120->offset;
        uVar101._4_4_ = pvVar120->type;
        uVar102._0_4_ = pvVar120->intRangeMin;
        uVar102._4_4_ = pvVar120->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar101;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar101 >> 8);
        pAVar118->divisor = (int)((ulong)uVar101 >> 0x20);
        pAVar118->offset = (undefined4)uVar102;
        pAVar118->normalized = (char)((ulong)uVar102 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar102 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar100;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar100 >> 8);
        pAVar118->size = (int)((ulong)uVar100 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if ((value_type *)local_118._8_8_ != pvVar120) {
      memmove((void *)local_150._0_8_,pvVar120,(size_t)pvVar122);
      pvVar116 = pvVar120;
    }
  }
  uVar64 = local_150._0_8_;
  local_150._8_8_ = (GLboolean *)local_150._0_8_ + (long)&pvVar122->count;
  local_138 = 0;
  uVar5 = local_118._0_8_;
  uVar119 = uVar111 - local_118._0_8_;
  uVar4 = local_170._0_8_;
  uVar117 = (long)local_160 - local_170._0_8_;
  if (uVar117 < uVar119) {
    pAVar114 = std::
               _Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
               ::_M_allocate((_Vector_base<deqp::gles3::Functional::(anonymous_namespace)::Attribute,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Attribute>_>
                              *)(((long)uVar119 >> 2) * -0x71c71c71c71c71c7),(size_t)pvVar116);
    pAVar118 = pAVar114;
    for (pvVar116 = (value_type *)uVar5; pvVar116 != (value_type *)uVar111;
        pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
      pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
      uVar103._0_4_ = pvVar116->count;
      uVar103._4_4_ = pvVar116->size;
      iVar109 = pvVar116->componentCount;
      iVar110 = pvVar116->stride;
      uVar104._0_4_ = pvVar116->offset;
      uVar104._4_4_ = pvVar116->type;
      uVar105._0_4_ = pvVar116->intRangeMin;
      uVar105._4_4_ = pvVar116->intRangeMax;
      pAVar118->integer = (char)(undefined4)uVar104;
      *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar104 >> 8);
      pAVar118->divisor = (int)((ulong)uVar104 >> 0x20);
      pAVar118->offset = (undefined4)uVar105;
      pAVar118->normalized = (char)((ulong)uVar105 >> 0x20);
      *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar105 >> 0x28);
      pAVar118->enabled = (char)(undefined4)uVar103;
      *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar103 >> 8);
      pAVar118->size = (int)((ulong)uVar103 >> 0x20);
      pAVar118->stride = iVar109;
      pAVar118->type = iVar110;
      pAVar118 = pAVar118 + 1;
    }
    if ((pointer)uVar4 != (pointer)0x0) {
      operator_delete((void *)uVar4,uVar117);
    }
    local_160 = (pointer)((long)pAVar114 + uVar119);
    local_170._0_8_ = pAVar114;
  }
  else {
    pAVar118 = (pointer)local_170._8_8_;
    uVar117 = local_170._8_8_ - local_170._0_8_;
    if (uVar117 < uVar119) {
      if (local_170._8_8_ != local_170._0_8_) {
        memmove((void *)local_170._0_8_,(void *)local_118._0_8_,uVar117);
      }
      for (pvVar116 = (value_type *)(uVar117 + uVar5); pvVar116 != (value_type *)uVar111;
          pvVar116 = (value_type *)&pvVar116->floatRangeMax) {
        pAVar118->bufferNdx = (int)pvVar116->floatRangeMin;
        uVar106._0_4_ = pvVar116->count;
        uVar106._4_4_ = pvVar116->size;
        iVar109 = pvVar116->componentCount;
        iVar110 = pvVar116->stride;
        uVar107._0_4_ = pvVar116->offset;
        uVar107._4_4_ = pvVar116->type;
        uVar108._0_4_ = pvVar116->intRangeMin;
        uVar108._4_4_ = pvVar116->intRangeMax;
        pAVar118->integer = (char)(undefined4)uVar107;
        *(int3 *)&pAVar118->field_0x11 = (int3)((ulong)uVar107 >> 8);
        pAVar118->divisor = (int)((ulong)uVar107 >> 0x20);
        pAVar118->offset = (undefined4)uVar108;
        pAVar118->normalized = (char)((ulong)uVar108 >> 0x20);
        *(int3 *)&pAVar118->field_0x1d = (int3)((ulong)uVar108 >> 0x28);
        pAVar118->enabled = (char)(undefined4)uVar106;
        *(int3 *)&pAVar118->field_0x1 = (int3)((ulong)uVar106 >> 8);
        pAVar118->size = (int)((ulong)uVar106 >> 0x20);
        pAVar118->stride = iVar109;
        pAVar118->type = iVar110;
        pAVar118 = pAVar118 + 1;
      }
    }
    else if (uVar111 != local_118._0_8_) {
      memmove((void *)local_170._0_8_,(void *)local_118._0_8_,uVar119);
    }
  }
  uVar4 = local_170._0_8_;
  local_170._8_8_ = uVar119 + local_170._0_8_;
  local_158 = 0;
  local_190._0_8_ = local_190._0_8_ & 0xffffffff;
  uStack_17c = 0x3000000000;
  local_190._12_8_ = 0x1403;
  iStack_174 = 0x18;
  local_138 = 2;
  pVVar115 = (VertexArrayObjectTest *)operator_new(0x138);
  pTVar112 = local_f0;
  VertexArrayObjectTest::VertexArrayObjectTest
            (pVVar115,(Context *)local_f0[1]._vptr_TestNode,(Spec *)local_190,"diff_indices",
             "diff_indices");
  tcu::TestNode::addChild(pTVar112,(TestNode *)pVVar115);
  if ((value_type *)uVar5 != (value_type *)0x0) {
    operator_delete((void *)uVar5,(long)local_108 - uVar5);
  }
  if ((pointer)local_130._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_130._0_8_,(long)local_120 - local_130._0_8_);
  }
  pTVar112 = local_f0;
  if ((pointer)uVar64 != (pointer)0x0) {
    operator_delete((void *)uVar64,(long)local_140 - uVar64);
  }
  if ((pointer)uVar4 != (pointer)0x0) {
    operator_delete((void *)uVar4,(long)local_160 - uVar4);
  }
  this_00 = (MultiVertexArrayObjectTest *)operator_new(0x138);
  MultiVertexArrayObjectTest::MultiVertexArrayObjectTest
            (this_00,(Context *)pTVar112[1]._vptr_TestNode,"all_attributes","all_attributes");
  tcu::TestNode::addChild(pTVar112,(TestNode *)this_00);
  return extraout_EAX;
}

Assistant:

void VertexArrayObjectTestGroup::init (void)
{
	BufferSpec floatCoordBuffer48_1 = { 48, 384, 2, 0, 0, GL_FLOAT, 0, 0, -1.0f, 1.0f };
	BufferSpec floatCoordBuffer48_2 = { 48, 384, 2, 0, 0, GL_FLOAT, 0, 0, -1.0f, 1.0f };

	BufferSpec shortCoordBuffer48 = { 48, 192, 2, 0, 0, GL_SHORT, -32768, 32768, 0.0f, 0.0f };

	// Different buffer
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_FLOAT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_FALSE;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(floatCoordBuffer48_1);
		spec.buffers.push_back(floatCoordBuffer48_2);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 48;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.state.attributes[0].bufferNdx	= 1;
		spec.vao.attributes[0].bufferNdx	= 2;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_buffer", "diff_buffer"));
	}
	// Different size
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_FLOAT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_FALSE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(floatCoordBuffer48_1);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.state.attributes[0].size		= 2;
		spec.vao.attributes[0].size			= 3;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_size", "diff_size"));
	}

	// Different stride
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].stride	= 2;
		spec.state.attributes[0].stride	= 4;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_stride", "diff_stride"));
	}

	// Different types
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].type		= GL_SHORT;
		spec.state.attributes[0].type	= GL_BYTE;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_type", "diff_type"));
	}
	// Different "integer"
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_BYTE;
		state.attributes[0].integer		= GL_TRUE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_FALSE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.instances			= 0;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.state.attributes[0].integer	= GL_FALSE;
		spec.vao.attributes[0].integer		= GL_TRUE;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_integer", "diff_integer"));
	}
	// Different divisor
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());
		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.attributes[1].enabled		= true;
		state.attributes[1].size		= 4;
		state.attributes[1].stride		= 0;
		state.attributes[1].type		= GL_FLOAT;
		state.attributes[1].integer		= GL_FALSE;
		state.attributes[1].divisor		= 0;
		state.attributes[1].offset		= 0;
		state.attributes[1].normalized	= GL_FALSE;
		state.attributes[1].bufferNdx	= 2;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);
		spec.buffers.push_back(floatCoordBuffer48_1);

		spec.useDrawElements	= false;
		spec.instances			= 10;
		spec.count				= 12;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[1].divisor		= 3;
		spec.state.attributes[1].divisor	= 2;

		addChild(new VertexArrayObjectTest(m_context, spec, "diff_divisor", "diff_divisor"));
	}
	// Different offset
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].offset	= 2;
		spec.state.attributes[0].offset	= 4;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_offset", "diff_offset"));
	}
	// Different normalize
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_SHORT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(shortCoordBuffer48);

		spec.useDrawElements	= false;
		spec.instances			= 0;
		spec.count				= 48;
		spec.vao				= state;
		spec.state				= state;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 0;
		spec.indexType			= GL_NONE;
		spec.indexCount			= 0;

		spec.vao.attributes[0].normalized	= GL_TRUE;
		spec.state.attributes[0].normalized	= GL_FALSE;;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_normalize", "diff_normalize"));
	}
	// DrawElements with buffer / Pointer
	{
		Spec spec;

		VertexArrayState state;

		state.attributes.push_back(Attribute());

		state.attributes[0].enabled		= true;
		state.attributes[0].size		= 2;
		state.attributes[0].stride		= 0;
		state.attributes[0].type		= GL_FLOAT;
		state.attributes[0].integer		= GL_FALSE;
		state.attributes[0].divisor		= 0;
		state.attributes[0].offset		= 0;
		state.attributes[0].normalized	= GL_TRUE;
		state.attributes[0].bufferNdx	= 1;

		state.elementArrayBuffer = 0;

		spec.buffers.push_back(floatCoordBuffer48_1);

		BufferSpec indexBuffer = { 24, 192, 1, 0, 0, GL_UNSIGNED_SHORT, 0, 48, 0.0f, 0.0f };
		spec.buffers.push_back(indexBuffer);

		spec.useDrawElements	= true;
		spec.count				= 24;
		spec.vao				= state;
		spec.state				= state;
		spec.instances			= 0;
		spec.indexOffset		= 0;
		spec.indexRangeMin		= 0;
		spec.indexRangeMax		= 48;
		spec.indexType			= GL_UNSIGNED_SHORT;
		spec.indexCount			= 24;

		spec.state.elementArrayBuffer	= 0;
		spec.vao.elementArrayBuffer		= 2;
		addChild(new VertexArrayObjectTest(m_context, spec, "diff_indices", "diff_indices"));
	}
	// Use all attributes

	addChild(new MultiVertexArrayObjectTest(m_context, "all_attributes", "all_attributes"));
}